

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_check_pub_priv(mbedtls_ecp_keypair *pub,mbedtls_ecp_keypair *prv)

{
  int iVar1;
  undefined1 local_168 [8];
  mbedtls_ecp_group grp;
  mbedtls_ecp_point Q;
  int ret;
  mbedtls_ecp_keypair *prv_local;
  mbedtls_ecp_keypair *pub_local;
  
  if (((((pub->grp).id == MBEDTLS_ECP_DP_NONE) || ((pub->grp).id != (prv->grp).id)) ||
      (iVar1 = mbedtls_mpi_cmp_mpi(&(pub->Q).X,&(prv->Q).X), iVar1 != 0)) ||
     ((iVar1 = mbedtls_mpi_cmp_mpi(&(pub->Q).Y,&(prv->Q).Y), iVar1 != 0 ||
      (iVar1 = mbedtls_mpi_cmp_mpi(&(pub->Q).Z,&(prv->Q).Z), iVar1 != 0)))) {
    pub_local._4_4_ = -0x4f80;
  }
  else {
    mbedtls_ecp_point_init((mbedtls_ecp_point *)&grp.T_size);
    mbedtls_ecp_group_init((mbedtls_ecp_group *)local_168);
    mbedtls_ecp_group_copy((mbedtls_ecp_group *)local_168,&prv->grp);
    Q.Z.p._4_4_ = mbedtls_ecp_mul((mbedtls_ecp_group *)local_168,(mbedtls_ecp_point *)&grp.T_size,
                                  &prv->d,&(prv->grp).G,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                                  (void *)0x0);
    if ((Q.Z.p._4_4_ == 0) &&
       (((iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&grp.T_size,&(prv->Q).X), iVar1 != 0 ||
         (iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&Q.X.p,&(prv->Q).Y), iVar1 != 0)) ||
        (iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&Q.Y.p,&(prv->Q).Z), iVar1 != 0)))) {
      Q.Z.p._4_4_ = -0x4f80;
    }
    mbedtls_ecp_point_free((mbedtls_ecp_point *)&grp.T_size);
    mbedtls_ecp_group_free((mbedtls_ecp_group *)local_168);
    pub_local._4_4_ = Q.Z.p._4_4_;
  }
  return pub_local._4_4_;
}

Assistant:

int mbedtls_ecp_check_pub_priv( const mbedtls_ecp_keypair *pub, const mbedtls_ecp_keypair *prv )
{
    int ret;
    mbedtls_ecp_point Q;
    mbedtls_ecp_group grp;

    if( pub->grp.id == MBEDTLS_ECP_DP_NONE ||
        pub->grp.id != prv->grp.id ||
        mbedtls_mpi_cmp_mpi( &pub->Q.X, &prv->Q.X ) ||
        mbedtls_mpi_cmp_mpi( &pub->Q.Y, &prv->Q.Y ) ||
        mbedtls_mpi_cmp_mpi( &pub->Q.Z, &prv->Q.Z ) )
    {
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
    }

    mbedtls_ecp_point_init( &Q );
    mbedtls_ecp_group_init( &grp );

    /* mbedtls_ecp_mul() needs a non-const group... */
    mbedtls_ecp_group_copy( &grp, &prv->grp );

    /* Also checks d is valid */
    MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &Q, &prv->d, &prv->grp.G, NULL, NULL ) );

    if( mbedtls_mpi_cmp_mpi( &Q.X, &prv->Q.X ) ||
        mbedtls_mpi_cmp_mpi( &Q.Y, &prv->Q.Y ) ||
        mbedtls_mpi_cmp_mpi( &Q.Z, &prv->Q.Z ) )
    {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

cleanup:
    mbedtls_ecp_point_free( &Q );
    mbedtls_ecp_group_free( &grp );

    return( ret );
}